

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall libcellml::Model::clean(Model *this)

{
  EntityImpl *pEVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  UnitsPtr u;
  undefined1 local_80 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  sVar3 = ComponentEntity::componentCount(&this->super_ComponentEntity);
  if (sVar3 != 0) {
    do {
      sVar3 = sVar3 - 1;
      ComponentEntity::component((ComponentEntity *)(local_80 + 0x10),(size_t)this);
      bVar2 = traverseHierarchyAndRemoveIfEmpty((ComponentPtr *)(local_80 + 0x10));
      if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
      }
      if (bVar2) {
        ComponentEntity::removeComponent(&this->super_ComponentEntity,sVar3);
      }
    } while (sVar3 != 0);
  }
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  lVar5 = pEVar1[4].mId.field_2._M_allocated_capacity - pEVar1[4].mId._M_string_length;
  if (lVar5 != 0) {
    sVar3 = lVar5 >> 4;
    do {
      sVar3 = sVar3 - 1;
      units((Model *)local_80,(size_t)this);
      bVar2 = ImportedEntity::isImport((ImportedEntity *)(local_80._0_8_ + 0x10));
      if (!bVar2) {
        NamedEntity::name_abi_cxx11_((string *)(local_80 + 0x10),(NamedEntity *)local_80._0_8_);
        if (local_68._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Entity::id_abi_cxx11_(&local_50,(Entity *)local_80._0_8_);
          if (local_50._M_string_length == 0) {
            sVar4 = Units::unitCount((Units *)local_80._0_8_);
            bVar2 = sVar4 == 0;
          }
          else {
            bVar2 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._16_8_ != &local_60) {
          operator_delete((void *)local_80._16_8_,local_60._M_allocated_capacity + 1);
        }
        if (bVar2) {
          removeUnits(this,sVar3);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
    } while (sVar3 != 0);
  }
  return;
}

Assistant:

void Model::clean()
{
    // Remove empty components.
    for (size_t i = componentCount() - 1; i != MAX_SIZE_T; --i) {
        if (traverseHierarchyAndRemoveIfEmpty(component(i))) {
            removeComponent(i);
        }
    }

    // Remove empty units.
    for (size_t i = unitsCount() - 1; i != MAX_SIZE_T; --i) {
        auto u = units(i);
        if (!u->isImport()
            && u->name().empty()
            && u->id().empty()
            && (u->unitCount() == 0)) {
            removeUnits(i);
        }
    }
}